

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyusdz.cc
# Opt level: O0

bool tinyusdz::IsUSDA(string *filename)

{
  bool bVar1;
  uchar *addr;
  size_type length;
  undefined1 local_50 [8];
  string err;
  undefined1 local_30 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  string *filename_local;
  
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)filename;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  ::std::__cxx11::string::string((string *)local_50);
  bVar1 = io::ReadFileHeader((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,
                             (string *)local_50,
                             (string *)
                             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,0xc,(void *)0x0);
  if (bVar1) {
    addr = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
    length = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
    filename_local._7_1_ = IsUSDA(addr,length);
  }
  else {
    filename_local._7_1_ = false;
  }
  ::std::__cxx11::string::~string((string *)local_50);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  return filename_local._7_1_;
}

Assistant:

bool IsUSDA(const std::string &filename) {
  // TODO: Read first few bytes and check the magic number.
  //
  std::vector<uint8_t> data;
  std::string err;
  // 12 = enough storage for "#usda 1.0"
  if (!io::ReadFileHeader(&data, &err, filename, 12,
                          /* userdata */ nullptr)) {
    // TODO: return `err`
    return false;
  }

  return IsUSDA(data.data(), data.size());
}